

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O0

size_t pstore::command_line::details::get_max_width(void)

{
  uint uVar1;
  undefined8 local_10;
  size_t max_width;
  
  uVar1 = anon_unknown.dwarf_12c742::terminal_width();
  local_10 = (ulong)uVar1;
  if (local_10 == 0) {
    local_10 = 0x50;
  }
  if (local_10 < 0x14) {
    local_10 = 0x28;
  }
  return local_10;
}

Assistant:

std::size_t get_max_width () {
                    std::size_t max_width = terminal_width ();
                    if (max_width == 0U) {
                        // We couldn't figure out the terminal width, so just guess at 80.
                        max_width = 80U;
                    }
                    if (max_width < overlong_opt_max) {
                        max_width = overlong_opt_max * 2U;
                    }
                    return max_width;
                }